

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_video.cpp
# Opt level: O3

void V_Init2(void)

{
  uint32 *puVar1;
  undefined4 uVar2;
  PClass *pPVar3;
  DFrameBuffer *pDVar4;
  int iVar5;
  undefined4 extraout_var;
  DFrameBuffer *s;
  bool bVar7;
  int height;
  int width;
  uint local_18;
  uint local_14;
  PClass *pPVar6;
  
  pDVar4 = screen;
  pPVar3 = DDummyFrameBuffer::RegistrationInfo.MyClass;
  pPVar6 = (screen->super_DSimpleCanvas).super_DCanvas.super_DObject.Class;
  if (pPVar6 == (PClass *)0x0) {
    iVar5 = (**(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject)(screen);
    pPVar6 = (PClass *)CONCAT44(extraout_var,iVar5);
    (pDVar4->super_DSimpleCanvas).super_DCanvas.super_DObject.Class = pPVar6;
  }
  pDVar4 = screen;
  bVar7 = pPVar6 != (PClass *)0x0;
  if (pPVar6 != pPVar3 && bVar7) {
    do {
      pPVar6 = pPVar6->ParentClass;
      bVar7 = pPVar6 != (PClass *)0x0;
      if (pPVar6 == pPVar3) break;
    } while (pPVar6 != (PClass *)0x0);
  }
  if (bVar7) {
    local_14 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
    local_18 = (screen->super_DSimpleCanvas).super_DCanvas.Height;
    uVar2 = *(undefined4 *)&screen[1].super_DSimpleCanvas.super_DCanvas.super_DObject._vptr_DObject;
    screen = (DFrameBuffer *)0x0;
    puVar1 = &(pDVar4->super_DSimpleCanvas).super_DCanvas.super_DObject.ObjectFlags;
    *(byte *)puVar1 = (byte)*puVar1 | 0x80;
    (*(pDVar4->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[2])();
    I_InitGraphics();
    I_ClosestResolution((int *)&local_14,(int *)&local_18,8);
    iVar5 = (*Video->_vptr_IVideo[7])(Video,(ulong)local_14,(ulong)local_18,8);
    if ((char)iVar5 == '\0') {
      I_FatalError("Could not set resolution to %d x %d x %d",(ulong)local_14,(ulong)local_18,8);
    }
    else {
      Printf("Resolution: %d x %d\n",(ulong)(uint)(screen->super_DSimpleCanvas).super_DCanvas.Width,
             (ulong)(uint)(screen->super_DSimpleCanvas).super_DCanvas.Height);
    }
    (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x1d])(uVar2);
    (*Renderer->_vptr_FRenderer[5])();
    FBaseCVar::ResetColors();
    C_NewModeAdjust();
    M_InitVideoModesMenu();
    V_SetBorderNeedRefresh();
    setsizeneeded = true;
    return;
  }
  __assert_fail("screen->IsKindOf(RUNTIME_CLASS(DDummyFrameBuffer))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/v_video.cpp"
                ,0x61c,"void V_Init2()");
}

Assistant:

void V_Init2()
{
	assert (screen->IsKindOf(RUNTIME_CLASS(DDummyFrameBuffer)));
	int width = screen->GetWidth();
	int height = screen->GetHeight();
	float gamma = static_cast<DDummyFrameBuffer *>(screen)->Gamma;

	{
		DFrameBuffer *s = screen;
		screen = NULL;
		s->ObjectFlags |= OF_YesReallyDelete;
		delete s;
	}

	I_InitGraphics();
	I_ClosestResolution (&width, &height, 8);

	if (!Video->SetResolution (width, height, 8))
		I_FatalError ("Could not set resolution to %d x %d x %d", width, height, 8);
	else
		Printf ("Resolution: %d x %d\n", SCREENWIDTH, SCREENHEIGHT);

	screen->SetGamma (gamma);
	Renderer->RemapVoxels();
	FBaseCVar::ResetColors ();
	C_NewModeAdjust();
	M_InitVideoModesMenu();
	V_SetBorderNeedRefresh();
	setsizeneeded = true;
}